

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O3

void __thiscall tonk::Connection::onAckSendTimer(Connection *this,uint64_t nowUsec)

{
  uint uVar1;
  uint64_t timeoutUsec;
  Result result;
  Result local_20;
  
  SessionIncoming::PostAcknowledgements((SessionIncoming *)&stack0xffffffffffffffe0);
  if ((RefCounter *)local_20.Error != (RefCounter *)0x0) {
    RefCounter::StartShutdown(&(this->super_IConnection).SelfRefCount,8,&stack0xffffffffffffffe0);
  }
  uVar1 = 50000;
  if (((this->TimeSync).Synchronized._M_base._M_i & 1U) != 0) {
    uVar1 = (this->TimeSync).MinimumOneWayDelayUsec.super___atomic_base<unsigned_int>._M_i >> 1;
  }
  timeoutUsec = 50000;
  if (50000 < uVar1) {
    timeoutUsec = (uint64_t)uVar1;
  }
  Timer::SetTimeoutUsec(&this->AcknowledgementTimer,timeoutUsec,Stop);
  Timer::Start(&this->AcknowledgementTimer,nowUsec);
  Result::~Result(&stack0xffffffffffffffe0);
  return;
}

Assistant:

void Connection::onAckSendTimer(uint64_t nowUsec)
{
    Result result = Incoming.PostAcknowledgements();
    if (result.IsFail()) {
        SelfRefCount.StartShutdown(Tonk_FECFailed, result);
    }

    // Find latest flow control interval
    unsigned intervalUsec = protocol::kMinAckIntervalUsec;
    if (TimeSync.IsSynchronized())
    {
        // Otherwise send up to two acknowledgements per OWD, in case one gets lost.
        // If the data rate is very low, Ack-Acks will stop us from sending a ton of Acks.
        const uint64_t owdUsec = TimeSync.GetMinimumOneWayDelayUsec();
        intervalUsec = static_cast<unsigned>(owdUsec) / 2;
    }
    if (intervalUsec < protocol::kMinAckIntervalUsec) {
        intervalUsec = protocol::kMinAckIntervalUsec;
    }

    AcknowledgementTimer.SetTimeoutUsec(intervalUsec);
    AcknowledgementTimer.Start(nowUsec);
}